

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_DeleteNodes(UA_Server *server,UA_Session *session,UA_DeleteNodesRequest *request,
                        UA_DeleteNodesResponse *response)

{
  size_t sVar1;
  UA_StatusCode UVar2;
  UA_StatusCode *pUVar3;
  UA_DeleteNodesResponse *pUVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  
  sVar1 = request->nodesToDeleteSize;
  if (sVar1 == 0) {
    UVar2 = 0x800f0000;
  }
  else {
    pUVar4 = response;
    pUVar3 = (UA_StatusCode *)malloc(sVar1 * 4);
    response->results = pUVar3;
    if (pUVar3 != (UA_StatusCode *)0x0) {
      response->resultsSize = sVar1;
      lVar5 = 0;
      uVar6 = 0;
      do {
        UVar2 = deleteNode(server,(UA_Session *)
                                  ((long)&(request->nodesToDelete->nodeId).namespaceIndex + lVar5),
                           (UA_NodeId *)
                           (ulong)(&request->nodesToDelete->deleteTargetReferences)[lVar5],
                           SUB81(pUVar4,0));
        pUVar4 = (UA_DeleteNodesResponse *)response->results;
        *(UA_StatusCode *)((long)&(pUVar4->responseHeader).timestamp + uVar6 * 4) = UVar2;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (uVar6 < request->nodesToDeleteSize);
      return;
    }
    UVar2 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void Service_DeleteNodes(UA_Server *server, UA_Session *session,
                         const UA_DeleteNodesRequest *request,
                         UA_DeleteNodesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteNodesRequest");
    if(request->nodesToDeleteSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->nodesToDeleteSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;;
        return;
    }
    response->resultsSize = request->nodesToDeleteSize;

    for(size_t i = 0; i < request->nodesToDeleteSize; ++i) {
        UA_DeleteNodesItem *item = &request->nodesToDelete[i];
        response->results[i] = deleteNode(server, session, &item->nodeId,
                                          item->deleteTargetReferences);
    }
}